

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int JX9StreamData_Open(char *zName,int iMode,jx9_value *pResource,void **ppHandle)

{
  sxi32 sVar1;
  ushort **ppuVar2;
  jx9_stream_data *pjVar3;
  bool bVar4;
  jx9_vm *local_58;
  byte *local_48;
  SyString sStream;
  jx9_stream_data *pData;
  void **ppHandle_local;
  jx9_value *pResource_local;
  int iMode_local;
  char *zName_local;
  
  sStream.zString._0_4_ = SyStrlen(zName);
  local_48 = (byte *)zName;
  while( true ) {
    bVar4 = false;
    if (((sxu32)sStream.zString != 0) && (bVar4 = false, *local_48 < 0xc0)) {
      ppuVar2 = __ctype_b_loc();
      bVar4 = ((*ppuVar2)[(int)(char)*local_48] & 0x2000) != 0;
    }
    if (!bVar4) break;
    sStream.zString._0_4_ = (sxu32)sStream.zString - 1;
    local_48 = local_48 + 1;
  }
  while( true ) {
    bVar4 = false;
    if (((sxu32)sStream.zString != 0) &&
       (bVar4 = false, local_48[(sxu32)sStream.zString - 1] < 0xc0)) {
      ppuVar2 = __ctype_b_loc();
      bVar4 = ((*ppuVar2)[(int)(char)local_48[(sxu32)sStream.zString - 1]] & 0x2000) != 0;
    }
    if (!bVar4) break;
    sStream.zString._0_4_ = (sxu32)sStream.zString - 1;
  }
  sVar1 = SyStrnicmp((char *)local_48,"stdin",5);
  if (sVar1 == 0) {
    pResource_local._4_4_ = 1;
  }
  else {
    sVar1 = SyStrnicmp((char *)local_48,"output",6);
    if (sVar1 == 0) {
      pResource_local._4_4_ = 4;
    }
    else {
      sVar1 = SyStrnicmp((char *)local_48,"stdout",6);
      if (sVar1 == 0) {
        pResource_local._4_4_ = 2;
      }
      else {
        sVar1 = SyStrnicmp((char *)local_48,"stderr",6);
        if (sVar1 != 0) {
          return -1;
        }
        pResource_local._4_4_ = 3;
      }
    }
  }
  if (pResource == (jx9_value *)0x0) {
    local_58 = (jx9_vm *)0x0;
  }
  else {
    local_58 = pResource->pVm;
  }
  pjVar3 = JX9StreamDataInit(local_58,pResource_local._4_4_);
  if (pjVar3 == (jx9_stream_data *)0x0) {
    zName_local._4_4_ = -1;
  }
  else {
    *ppHandle = pjVar3;
    zName_local._4_4_ = 0;
  }
  return zName_local._4_4_;
}

Assistant:

static int JX9StreamData_Open(const char *zName, int iMode, jx9_value *pResource, void ** ppHandle)
{
	jx9_stream_data *pData;
	SyString sStream;
	SyStringInitFromBuf(&sStream, zName, SyStrlen(zName));
	/* Trim leading and trailing white spaces */
	SyStringFullTrim(&sStream);
	/* Stream to open */
	if( SyStrnicmp(sStream.zString, "stdin", sizeof("stdin")-1) == 0 ){
		iMode = JX9_IO_STREAM_STDIN;
	}else if( SyStrnicmp(sStream.zString, "output", sizeof("output")-1) == 0 ){
		iMode = JX9_IO_STREAM_OUTPUT;
	}else if( SyStrnicmp(sStream.zString, "stdout", sizeof("stdout")-1) == 0 ){
		iMode = JX9_IO_STREAM_STDOUT;
	}else if( SyStrnicmp(sStream.zString, "stderr", sizeof("stderr")-1) == 0 ){
		iMode = JX9_IO_STREAM_STDERR;
	}else{
		/* unknown stream name */
		return -1;
	}
	/* Create our handle */
	pData = JX9StreamDataInit(pResource?pResource->pVm:0, iMode);
	if( pData == 0 ){
		return -1;
	}
	/* Make the handle public */
	*ppHandle = (void *)pData;
	return JX9_OK;
}